

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserClass.cc
# Opt level: O3

map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
ParserClass::parseAggFunc_abi_cxx11_
          (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,ParserClass *this)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  pointer pcVar3;
  _Base_ptr p_Var4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  pointer pbVar7;
  int index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> aggFunc;
  key_type local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbVar7 = (this->inputs).aggre_funcs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->inputs).aggre_funcs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != pbVar2) {
    do {
      pcVar3 = (pbVar7->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + pbVar7->_M_string_length);
      if ((byte)(*local_50._M_dataplus._M_p + 0x9fU) < 0x1a) {
        p_Var4 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 = &p_Var1->_M_header;
        if (p_Var4 != (_Base_ptr)0x0) {
          do {
            if (-1 < (int)(uint)*(size_t *)(p_Var4 + 1)) {
              p_Var6 = p_Var4;
            }
            p_Var4 = (&p_Var4->_M_left)[(uint)*(size_t *)(p_Var4 + 1) >> 0x1f];
          } while (p_Var4 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
             ((int)((_Rb_tree_header *)p_Var6)->_M_node_count < 1)) {
            std::operator+(&local_70,", ",&local_50);
            local_74 = 0;
            pmVar5 = std::
                     map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](__return_storage_ptr__,&local_74);
            std::__cxx11::string::_M_append
                      ((char *)pmVar5,
                       CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_));
LAB_00104c86:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_) !=
                &local_70.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_70._M_dataplus._M_p._4_4_,
                                       local_70._M_dataplus._M_p._0_4_));
            }
            goto LAB_00104c9a;
          }
        }
        local_70._M_dataplus._M_p._0_4_ = 0;
        pmVar5 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,(key_type *)&local_70);
        std::__cxx11::string::_M_assign((string *)pmVar5);
      }
      else {
        local_74 = *local_50._M_dataplus._M_p + -0x30;
        p_Var4 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 = &p_Var1->_M_header;
        if (p_Var4 != (_Base_ptr)0x0) {
          do {
            if (local_74 <= (int)*(size_t *)(p_Var4 + 1)) {
              p_Var6 = p_Var4;
            }
            p_Var4 = (&p_Var4->_M_left)[(int)*(size_t *)(p_Var4 + 1) < local_74];
          } while (p_Var4 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
             ((int)((_Rb_tree_header *)p_Var6)->_M_node_count <= local_74)) {
            std::operator+(&local_70,", ",&local_50);
            pmVar5 = std::
                     map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](__return_storage_ptr__,&local_74);
            std::__cxx11::string::_M_append
                      ((char *)pmVar5,
                       CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_));
            goto LAB_00104c86;
          }
        }
        pmVar5 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,&local_74);
        std::__cxx11::string::_M_assign((string *)pmVar5);
      }
LAB_00104c9a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<int, std::string> ParserClass::parseAggFunc()
{
    std::map<int, std::string> agg_map;
    for (auto aggFunc : this->inputs.aggre_funcs)
    {
        if ('a' <= aggFunc[0] && aggFunc[0] <= 'z')
        {
            if (agg_map.find(0) == agg_map.end())
            {
                agg_map[0] = aggFunc;
                continue;
            }
            agg_map[0] += ", " + aggFunc;
        }
        else
        {
            int index = aggFunc[0] - '0';
            if (agg_map.find(index) == agg_map.end())
            {
                agg_map[index] = aggFunc;
                continue;
            }
            agg_map[index] += ", " + aggFunc;
        }
    }
    return agg_map;
}